

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

MeanSquaredErrorLossLayer * __thiscall
CoreML::Specification::LossLayer::mutable_meansquarederrorlosslayer(LossLayer *this)

{
  MeanSquaredErrorLossLayer *this_00;
  
  if (this->_oneof_case_[0] == 0xb) {
    this_00 = (MeanSquaredErrorLossLayer *)(this->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    clear_LossLayerType(this);
    this->_oneof_case_[0] = 0xb;
    this_00 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_00);
    (this->LossLayerType_).meansquarederrorlosslayer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::MeanSquaredErrorLossLayer* LossLayer::mutable_meansquarederrorlosslayer() {
  if (!has_meansquarederrorlosslayer()) {
    clear_LossLayerType();
    set_has_meansquarederrorlosslayer();
    LossLayerType_.meansquarederrorlosslayer_ = new ::CoreML::Specification::MeanSquaredErrorLossLayer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LossLayer.meanSquaredErrorLossLayer)
  return LossLayerType_.meansquarederrorlosslayer_;
}